

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperH.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
CShArchitecture::parseOpcode(CShArchitecture *this,Parser *parser)

{
  ShParser shParser;
  _func_int **local_c8 [2];
  char *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined8 uStack_a0;
  char *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined8 uStack_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined1 local_48;
  
  local_b0._8_8_ = 0;
  uStack_a0._0_4_ = 0;
  uStack_a0._4_4_ = 0;
  local_b0._M_allocated_capacity = 0;
  local_80._8_8_ = 0;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_80._M_allocated_capacity = 0;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = 1;
  local_b8 = local_b0._M_local_buf + 8;
  local_88 = local_80._M_local_buf + 8;
  ShParser::parseOpcode((ShParser *)local_c8,(Parser *)(local_c8 + 1));
  (this->super_Architecture)._vptr_Architecture = local_c8[0];
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  if (local_88 != local_80._M_local_buf + 8) {
    operator_delete(local_88,local_80._8_8_ + 1);
  }
  if (local_b8 != local_b0._M_local_buf + 8) {
    operator_delete(local_b8,local_b0._8_8_ + 1);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> CShArchitecture::parseOpcode(Parser& parser)
{
	ShParser shParser;
	return shParser.parseOpcode(parser);
}